

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,AmountMap *map_target_value,vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          AmountMap *map_select_value,Amount *utxo_fee_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map_searched_bnb,AmountMap *map_utxo_fee_value)

{
  _Rb_tree_node_base *p_Var1;
  uint64_t uVar2;
  mapped_type mVar3;
  pointer pUVar4;
  char cVar5;
  __type _Var6;
  iterator iVar7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  CfdException *pCVar11;
  pointer pUVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_byte;
  AmountMap work_selected_values;
  AmountMap work_target_values;
  AmountMap work_map_utxo_fee_value;
  int64_t target_value;
  ConfidentialAssetId fee_asset;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  asset_utxos;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  anon_class_168_9_d2d4f853 coin_selection_function;
  Amount tx_fee_out;
  string local_90;
  Amount work_utxo_fee;
  Amount local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  work_searched_bnb;
  
  uVar2 = option_params->effective_fee_baserate_;
  if (uVar2 != 0) {
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&coin_selection_function,&option_params->fee_asset_);
    cVar5 = cfd::core::ConfidentialAssetId::IsEmpty();
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&coin_selection_function)
    ;
    if (cVar5 != '\0') {
      asset_utxos._M_t._M_impl._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
           + 99;
      asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x13e;
      asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)anon_var_dwarf_b128f;
      work_selected_values._M_t._M_impl._0_8_ = option_params->effective_fee_baserate_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&coin_selection_function,&option_params->fee_asset_);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      core::logger::warn<unsigned_long,std::__cxx11::string>
                ((CfdSourceLocation *)&asset_utxos,
                 "Failed to SelectCoins. Fee calculation option error.: effective_fee_base_rate=[{}], fee_asset=[{}]"
                 ,(unsigned_long *)&work_selected_values,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &work_target_values);
      std::__cxx11::string::~string((string *)&work_target_values);
      core::ConfidentialAssetId::~ConfidentialAssetId
                ((ConfidentialAssetId *)&coin_selection_function);
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&coin_selection_function,
                 "Failed to SelectCoins. Fee calculation option error.",
                 (allocator *)&work_target_values);
      core::CfdException::CfdException
                (pCVar11,kCfdIllegalStateError,(string *)&coin_selection_function);
      __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if (map_select_value != (AmountMap *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::_Rb_tree(&work_target_values._M_t,&map_target_value->_M_t);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset);
    if ((uVar2 != 0) && (option_params->has_ignore_fee_asset_ == false)) {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&coin_selection_function,&option_params->fee_asset_);
      cfd::core::ConfidentialAssetId::operator=
                (&fee_asset,(ConfidentialAssetId *)&coin_selection_function);
      core::ConfidentialAssetId::~ConfidentialAssetId
                ((ConfidentialAssetId *)&coin_selection_function);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::find(&work_target_values._M_t,(key_type *)&coin_selection_function);
      std::__cxx11::string::~string((string *)&coin_selection_function);
      if ((_Rb_tree_header *)iVar7._M_node == &work_target_values._M_t._M_impl.super__Rb_tree_header
         ) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        asset_utxos._M_t._M_impl._0_8_ = asset_utxos._M_t._M_impl._0_8_ & 0xffffffff00000000;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
        ::_M_emplace_unique<std::__cxx11::string,int>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                    *)&work_target_values,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &coin_selection_function,(int *)&asset_utxos);
        std::__cxx11::string::~string((string *)&coin_selection_function);
      }
    }
    asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header;
    asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    asset_utxos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         asset_utxos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector(&work_utxos,utxos);
    p_Var8 = work_target_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)p_Var8 == &work_target_values._M_t._M_impl.super__Rb_tree_header) {
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::reserve
                  (__return_storage_ptr__,
                   ((long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                         super__Vector_impl_data._M_start) / 0xd8);
        _tx_fee_out = *(undefined8 *)tx_fee_value;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cfd::core::Amount::Amount(&work_utxo_fee);
        work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
        work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header;
        work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffff00000000;
        work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        coin_selection_function.filter = (UtxoFilter)filter->reserved;
        work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        coin_selection_function.this = this;
        work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             work_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        CoinSelectionOption::CoinSelectionOption
                  (&coin_selection_function.option_params,option_params);
        coin_selection_function.tx_fee_out = &tx_fee_out;
        coin_selection_function.result = __return_storage_ptr__;
        coin_selection_function.work_selected_values = &work_selected_values;
        coin_selection_function.work_utxo_fee = &work_utxo_fee;
        coin_selection_function.work_searched_bnb = &work_searched_bnb;
        coin_selection_function.work_map_utxo_fee_value = &work_map_utxo_fee_value;
        for (p_Var8 = work_target_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &work_target_values._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          p_Var1 = p_Var8 + 1;
          _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)p_Var1,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&asset_byte);
          std::__cxx11::string::~string((string *)&asset_byte);
          if (!_Var6) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                     ::operator[](&asset_utxos,(key_type *)p_Var1);
            cfd::core::Amount::Amount((Amount *)&asset_byte);
            SelectCoins::anon_class_168_9_d2d4f853::operator()
                      (&coin_selection_function,(int64_t *)(p_Var8 + 2),pmVar9,(Amount *)&asset_byte
                       ,(string *)p_Var1,false);
          }
        }
        if ((uVar2 != 0) && (option_params->has_ignore_fee_asset_ == false)) {
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[](&work_target_values,(key_type *)&asset_byte);
          mVar3 = *pmVar10;
          std::__cxx11::string::~string((string *)&asset_byte);
          target_value = mVar3;
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                   ::operator[](&asset_utxos,(key_type *)&asset_byte);
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          SelectCoins::anon_class_168_9_d2d4f853::operator()
                    (&coin_selection_function,&target_value,pmVar9,&tx_fee_out,&local_90,true);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&asset_byte);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::operator=(&map_select_value->_M_t,&work_selected_values._M_t);
        if (utxo_fee_value != (Amount *)0x0) {
          utxo_fee_value[8] = local_68;
          *(undefined8 *)utxo_fee_value = _work_utxo_fee;
        }
        if (map_searched_bnb !=
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::operator=(&map_searched_bnb->_M_t,&work_searched_bnb._M_t);
        }
        if (map_utxo_fee_value != (AmountMap *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::operator=(&map_utxo_fee_value->_M_t,&work_map_utxo_fee_value._M_t);
        }
        core::ConfidentialAssetId::~ConfidentialAssetId
                  (&coin_selection_function.option_params.fee_asset_);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::~_Rb_tree(&work_map_utxo_fee_value._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::~_Rb_tree(&work_searched_bnb._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::~_Rb_tree(&work_selected_values._M_t);
        std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
                  (&work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
        ::~_Rb_tree(&asset_utxos._M_t);
        core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::~_Rb_tree(&work_target_values._M_t);
        return __return_storage_ptr__;
      }
      p_Var1 = p_Var8 + 1;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&coin_selection_function,(string *)p_Var1);
      cVar5 = cfd::core::ConfidentialAssetId::IsEmpty();
      if (cVar5 != '\0') break;
      work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      work_map_utxo_fee_value._M_t._M_impl._0_8_ = 0;
      work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
                ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)&work_map_utxo_fee_value,
                 ((long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(utxos->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0xd8);
      pUVar4 = work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pUVar12 = work_utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                     super__Vector_impl_data._M_start; pUVar12 != pUVar4; pUVar12 = pUVar12 + 1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&asset_byte,pUVar12->asset
                   ,&pUVar12->field_0xaa,(allocator_type *)&work_selected_values);
        cfd::core::ByteData::ByteData((ByteData *)&local_90,(vector *)&asset_byte);
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&work_selected_values,(ByteData *)&local_90);
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&work_searched_bnb);
        std::__cxx11::string::~string((string *)&work_searched_bnb);
        core::ConfidentialAssetId::~ConfidentialAssetId
                  ((ConfidentialAssetId *)&work_selected_values);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
        if (_Var6) {
          work_selected_values._M_t._M_impl._0_8_ = pUVar12;
          std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::emplace_back<cfd::Utxo*>
                    ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)&work_map_utxo_fee_value,
                     (Utxo **)&work_selected_values);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&asset_byte.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      if (work_map_utxo_fee_value._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ ==
          work_map_utxo_fee_value._M_t._M_impl._0_8_) {
        work_selected_values._M_t._M_impl._0_8_ =
             (long)
             "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
             + 99;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x172;
        work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)anon_var_dwarf_b128f;
        core::logger::warn<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)&work_selected_values,
                   "Failed to SelectCoins. Target asset is not found in utxo list.target_asset=[{}]"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1);
        pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&work_selected_values,
                   "Failed to SelectCoins. Target asset is not found in utxo list.",
                   (allocator *)&work_searched_bnb);
        core::CfdException::CfdException
                  (pCVar11,kCfdIllegalStateError,(string *)&work_selected_values);
        __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
      ::
      _M_emplace_unique<std::__cxx11::string_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
                  *)&asset_utxos,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1,
                 (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)&work_map_utxo_fee_value);
      std::_Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::~_Vector_base
                ((_Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)&work_map_utxo_fee_value
                );
      core::ConfidentialAssetId::~ConfidentialAssetId
                ((ConfidentialAssetId *)&coin_selection_function);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    }
    work_selected_values._M_t._M_impl._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
         + 99;
    work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x160;
    work_selected_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)anon_var_dwarf_b128f;
    core::logger::warn<>
              ((CfdSourceLocation *)&work_selected_values,
               "Failed to SelectCoins. Target asset is empty.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&work_selected_values,"Failed to SelectCoins. Target asset is empty.",
               (allocator *)&work_searched_bnb);
    core::CfdException::CfdException(pCVar11,kCfdIllegalStateError,(string *)&work_selected_values);
    __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  coin_selection_function.this = (CoinSelection *)0x27fd98;
  coin_selection_function.filter.reserved = 0x148;
  coin_selection_function.option_params._0_8_ = anon_var_dwarf_b128f;
  core::logger::warn<>
            ((CfdSourceLocation *)&coin_selection_function,
             "Failed to SelectCoins. map_select_value is empty.");
  pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&coin_selection_function,"Failed to SelectCoins. map_select_value is empty.",
             (allocator *)&work_target_values);
  core::CfdException::CfdException(pCVar11,kCfdIllegalStateError,(string *)&coin_selection_function)
  ;
  __cxa_throw(pCVar11,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const AmountMap& map_target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, AmountMap* map_select_value,
    Amount* utxo_fee_value, std::map<std::string, bool>* map_searched_bnb,
    AmountMap* map_utxo_fee_value) {
  bool calculate_fee = (option_params.GetEffectiveFeeBaserate() != 0);
  if (calculate_fee && option_params.GetFeeAsset().IsEmpty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to SelectCoins. Fee calculation option error."
        ": effective_fee_base_rate=[{}], fee_asset=[{}]",
        option_params.GetEffectiveFeeBaserate(),
        option_params.GetFeeAsset().GetHex());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. Fee calculation option error.");
  }
  if (map_select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Failed to SelectCoins. map_select_value is empty.");
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. map_select_value is empty.");
  }

  // add fee asset to target asset list
  AmountMap work_target_values = map_target_value;
  ConfidentialAssetId fee_asset;
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    fee_asset = option_params.GetFeeAsset();
    auto iter = work_target_values.find(fee_asset.GetHex());
    if (iter == std::end(work_target_values)) {
      work_target_values.emplace(fee_asset.GetHex(), 0);
    }
  }

  // asset exists check
  std::map<std::string, std::vector<Utxo*>> asset_utxos;
  std::vector<Utxo> work_utxos = utxos;
  for (auto& target : work_target_values) {
    // asset valid check...
    ConfidentialAssetId target_asset(target.first);
    if (target_asset.IsEmpty()) {
      warn(CFD_LOG_SOURCE, "Failed to SelectCoins. Target asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is empty.");
    }

    // convert utxo list to ptr
    std::vector<Utxo*> p_utxos;
    p_utxos.reserve(utxos.size());
    for (auto& utxo : work_utxos) {
      std::vector<uint8_t> asset_byte(
          std::begin(utxo.asset), std::end(utxo.asset));
      if (target.first == ConfidentialAssetId(asset_byte).GetHex()) {
        p_utxos.push_back(&utxo);
      }
    }
    if (p_utxos.size() == 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Target asset is not found in utxo list."
          "target_asset=[{}]",
          target.first);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is not found in utxo list.");
    }

    asset_utxos.emplace(target.first, p_utxos);
  }

  // coin selection function
  std::vector<Utxo> result;
  result.reserve(utxos.size());
  Amount tx_fee_out = tx_fee_value;
  AmountMap work_selected_values;
  Amount work_utxo_fee = Amount();
  std::map<std::string, bool> work_searched_bnb;
  AmountMap work_map_utxo_fee_value;
  auto coin_selection_function = [this, filter, option_params, &result,
                                  &tx_fee_out, &work_selected_values,
                                  &work_utxo_fee, &work_searched_bnb,
                                  &work_map_utxo_fee_value](
                                     const int64_t& target_value,
                                     const std::vector<Utxo*>& utxos,
                                     const Amount& tx_fee,
                                     const std::string& asset_id,
                                     bool consider_fee) {
    int64_t select_value_out = 0;
    Amount utxo_fee_out = Amount();
    bool use_bnb_out = false;
    std::vector<Utxo> ret_utxos = SelectCoinsMinConf(
        target_value, utxos, filter, option_params, tx_fee, consider_fee,
        &select_value_out, &utxo_fee_out, &use_bnb_out);
    std::copy(ret_utxos.begin(), ret_utxos.end(), std::back_inserter(result));
    tx_fee_out += utxo_fee_out;
    work_utxo_fee += utxo_fee_out;
    work_selected_values.emplace(asset_id, select_value_out);
    work_searched_bnb.emplace(asset_id, use_bnb_out);
    work_map_utxo_fee_value.emplace(asset_id, utxo_fee_out.GetSatoshiValue());
  };

  // do coin selection exclude fee asset
  for (auto& target : work_target_values) {
    // skip fee asset
    if (target.first == fee_asset.GetHex()) {
      continue;
    }

    // For assets other than fees, calculate without considering fees.
    const auto& target_value = target.second;
    coin_selection_function(
        target_value, asset_utxos[target.first], Amount(), target.first,
        false);
  }

  // do coin selection with fee asset
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    int64_t target_value = work_target_values[fee_asset.GetHex()];
    coin_selection_function(
        target_value, asset_utxos[fee_asset.GetHex()], tx_fee_out,
        fee_asset.GetHex(), true);
  }

  if (map_select_value != nullptr) {
    *map_select_value = work_selected_values;
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = work_utxo_fee;
  }
  if (map_searched_bnb != nullptr) {
    *map_searched_bnb = work_searched_bnb;
  }
  if (map_utxo_fee_value != nullptr) {
    *map_utxo_fee_value = work_map_utxo_fee_value;
  }
  return result;
}